

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void MonitoredItem_delete(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  MonitoredItem_queuedValue *pMVar1;
  MonitoredItem_queuedValue *val_tmp;
  MonitoredItem_queuedValue *val;
  UA_MonitoredItem *monitoredItem_local;
  UA_Server *server_local;
  
  MonitoredItem_unregisterSampleJob(server,monitoredItem);
  val_tmp = (monitoredItem->queue).tqh_first;
  while (val_tmp != (MonitoredItem_queuedValue *)0x0) {
    pMVar1 = (val_tmp->listEntry).tqe_next;
    if ((val_tmp->listEntry).tqe_next == (MonitoredItem_queuedValue *)0x0) {
      (monitoredItem->queue).tqh_last = (val_tmp->listEntry).tqe_prev;
    }
    else {
      (((val_tmp->listEntry).tqe_next)->listEntry).tqe_prev = (val_tmp->listEntry).tqe_prev;
    }
    *(val_tmp->listEntry).tqe_prev = (val_tmp->listEntry).tqe_next;
    UA_DataValue_deleteMembers(&val_tmp->value);
    free(val_tmp);
    val_tmp = pMVar1;
  }
  monitoredItem->currentQueueSize = 0;
  if ((monitoredItem->listEntry).le_next != (UA_MonitoredItem *)0x0) {
    (((monitoredItem->listEntry).le_next)->listEntry).le_prev = (monitoredItem->listEntry).le_prev;
  }
  *(monitoredItem->listEntry).le_prev = (monitoredItem->listEntry).le_next;
  UA_String_deleteMembers(&monitoredItem->indexRange);
  UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
  UA_NodeId_deleteMembers(&monitoredItem->monitoredNodeId);
  free(monitoredItem);
  return;
}

Assistant:

void MonitoredItem_delete(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    MonitoredItem_unregisterSampleJob(server, monitoredItem);
    /* clear the queued samples */
    MonitoredItem_queuedValue *val, *val_tmp;
    TAILQ_FOREACH_SAFE(val, &monitoredItem->queue, listEntry, val_tmp) {
        TAILQ_REMOVE(&monitoredItem->queue, val, listEntry);
        UA_DataValue_deleteMembers(&val->value);
        UA_free(val);
    }
    monitoredItem->currentQueueSize = 0;
    LIST_REMOVE(monitoredItem, listEntry);
    UA_String_deleteMembers(&monitoredItem->indexRange);
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    UA_NodeId_deleteMembers(&monitoredItem->monitoredNodeId);
    UA_free(monitoredItem);
}